

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ameth.c
# Opt level: O1

int gost_decode_nid_params(EVP_PKEY *pkey,int pkey_nid,int param_nid)

{
  int iVar1;
  EC_KEY *key;
  
  key = (EC_KEY *)EVP_PKEY_get0((EVP_PKEY *)pkey);
  if (((1 < pkey_nid - 0x3d3U) && (pkey_nid != 0x331)) && (pkey_nid != 0x32b)) {
    return 0;
  }
  if (key == (EC_KEY *)0x0) {
    key = (EC_KEY *)EC_KEY_new();
    iVar1 = EVP_PKEY_assign((EVP_PKEY *)pkey,pkey_nid,key);
    if (iVar1 == 0) {
      EC_KEY_free((EC_KEY *)key);
      return 0;
    }
  }
  iVar1 = fill_GOST_EC_params(key,param_nid);
  return iVar1;
}

Assistant:

static int gost_decode_nid_params(EVP_PKEY *pkey, int pkey_nid, int param_nid)
{
    void *key_ptr = EVP_PKEY_get0(pkey);

    switch (pkey_nid) {
    case NID_id_GostR3410_2012_256:
    case NID_id_GostR3410_2012_512:
    case NID_id_GostR3410_2001:
    case NID_id_GostR3410_2001DH:
        if (!key_ptr) {
            key_ptr = EC_KEY_new();
            if (!EVP_PKEY_assign(pkey, pkey_nid, key_ptr)) {
                EC_KEY_free(key_ptr);
                break;
            }
        }
        return fill_GOST_EC_params(key_ptr, param_nid);
    }

    return 0;
}